

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgkyt(fitsfile *fptr,char *keyname,long *ivalue,double *fraction,char *comm,int *status)

{
  char *cval;
  char *pcVar1;
  char *loc;
  char valstring [71];
  int *status_local;
  char *comm_local;
  double *fraction_local;
  long *ivalue_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    unique0x100000bd = status;
    ffgkey(fptr,keyname,(char *)&loc,comm,status);
    ffc2d((char *)&loc,fraction,stack0xffffffffffffffc0);
    *ivalue = (long)*fraction;
    *fraction = *fraction - (double)*ivalue;
    cval = strchr((char *)&loc,0x2e);
    if (((cval != (char *)0x0) && (pcVar1 = strchr((char *)&loc,0x45), pcVar1 == (char *)0x0)) &&
       (pcVar1 = strchr((char *)&loc,0x44), pcVar1 == (char *)0x0)) {
      ffc2d(cval,fraction,stack0xffffffffffffffc0);
    }
    fptr_local._4_4_ = *stack0xffffffffffffffc0;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgkyt( fitsfile *fptr,      /* I - FITS file pointer                 */
            const char   *keyname,     /* I - name of keyword to read           */
            long   *ivalue,      /* O - integer part of keyword value     */
            double *fraction,    /* O - fractional part of keyword value  */
            char   *comm,        /* O - keyword comment                   */
            int    *status)      /* IO - error status                     */
/*
  Read (get) the named keyword, returning the value and comment.
  The integer and fractional parts of the value are returned in separate
  variables, to allow more numerical precision to be passed.  This
  effectively passes a 'triple' precision value, with a 4-byte integer
  and an 8-byte fraction.  The comment may be up to 69 characters long.
*/
{
    char valstring[FLEN_VALUE];
    char *loc;

    if (*status > 0)
        return(*status);

    ffgkey(fptr, keyname, valstring, comm, status);  /* read the keyword */

    /*  read the entire value string as a double, to get the integer part */
    ffc2d(valstring, fraction, status);

    *ivalue = (long) *fraction;

    *fraction = *fraction - *ivalue;

    /* see if we need to read the fractional part again with more precision */
    /* look for decimal point, without an exponential E or D character */

    loc = strchr(valstring, '.');
    if (loc)
    {
        if (!strchr(valstring, 'E') && !strchr(valstring, 'D'))
            ffc2d(loc, fraction, status);
    }

    return(*status);
}